

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O1

wchar_t add_owner_name(archive_match *a,match_list *list,wchar_t mbs,void *name)

{
  wchar_t wVar1;
  match *pmVar2;
  
  pmVar2 = (match *)calloc(1,0x78);
  if (pmVar2 == (match *)0x0) {
    archive_set_error(&a->archive,0xc,"No memory");
    (a->archive).state = 0x8000;
    wVar1 = L'\xffffffe2';
  }
  else {
    if (mbs == L'\0') {
      archive_mstring_copy_wcs(&pmVar2->pattern,(wchar_t *)name);
    }
    else {
      archive_mstring_copy_mbs(&pmVar2->pattern,(char *)name);
    }
    *list->last = pmVar2;
    list->last = (match **)pmVar2;
    list->count = list->count + L'\x01';
    list->unmatched_count = list->unmatched_count + L'\x01';
    *(byte *)&a->setflag = (byte)a->setflag | 4;
    wVar1 = L'\0';
  }
  return wVar1;
}

Assistant:

static int
add_owner_name(struct archive_match *a, struct match_list *list,
    int mbs, const void *name)
{
	struct match *match;

	match = calloc(1, sizeof(*match));
	if (match == NULL)
		return (error_nomem(a));
	if (mbs)
		archive_mstring_copy_mbs(&(match->pattern), name);
	else
		archive_mstring_copy_wcs(&(match->pattern), name);
	match_list_add(list, match);
	a->setflag |= ID_IS_SET;
	return (ARCHIVE_OK);
}